

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FibHeap.h
# Opt level: O0

Node * __thiscall
FibHeap<std::pair<double,_int>_>::push
          (FibHeap<std::pair<double,_int>_> *this,pair<double,_int> *key)

{
  bool bVar1;
  Slot *x_00;
  pair<double,_int> *in_RSI;
  MemPool<FibHeap<std::pair<double,_int>_>::Node,_4096> *in_RDI;
  Node *x;
  pair<double,_int> *in_stack_ffffffffffffffd8;
  
  x_00 = (Slot *)MemPool<FibHeap<std::pair<double,int>>::Node,4096>::
                 newElem<std::pair<double,int>const&>(in_RDI,in_stack_ffffffffffffffd8);
  Node::push(&(in_RDI[1].freeSlot)->data,&x_00->data);
  if ((in_RDI[1].curBlock == (Slot *)0x0) ||
     (bVar1 = std::operator<(in_RSI,&((in_RDI[1].curBlock)->data).key), bVar1)) {
    in_RDI[1].curBlock = x_00;
  }
  return (Node *)x_00;
}

Assistant:

Node *push(const K &key)
	{
		Node *x = alloc.newElem(key);
		root->push(x);
		if (!min || key < min->key)
			min = x;
		return x;
	}